

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

int TTransform_SSE2(uint8_t *inA,uint8_t *inB,uint16_t *w)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  __m128i *out2;
  __m128i *out3;
  uint7 uVar25;
  undefined4 uVar26;
  undefined6 uVar27;
  uint7 uVar28;
  uint7 uVar29;
  uint7 uVar30;
  uint7 uVar31;
  undefined4 uVar32;
  undefined6 uVar33;
  uint7 uVar34;
  uint7 uVar35;
  uint7 uVar36;
  undefined1 (*in_RDX) [16];
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i d0;
  __m128i B_b2;
  __m128i B_b0;
  __m128i A_b2;
  __m128i A_b0;
  __m128i b3_1;
  __m128i b2_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a3_1;
  __m128i a2_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i w_8;
  __m128i w_0;
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  __m128i inAB_3;
  __m128i inAB_2;
  __m128i inAB_1;
  __m128i inAB_0;
  __m128i inB_3;
  __m128i inB_2;
  __m128i inB_1;
  __m128i inB_0;
  __m128i inA_3;
  __m128i inA_2;
  __m128i inA_1;
  __m128i inA_0;
  __m128i zero;
  __m128i tmp_3;
  __m128i tmp_2;
  __m128i tmp_1;
  __m128i tmp_0;
  int32_t sum [4];
  undefined2 in_stack_fffffffffffff678;
  undefined2 in_stack_fffffffffffff67a;
  undefined2 in_stack_fffffffffffff67c;
  undefined2 in_stack_fffffffffffff67e;
  undefined2 in_stack_fffffffffffff680;
  undefined2 in_stack_fffffffffffff682;
  undefined2 in_stack_fffffffffffff684;
  undefined2 in_stack_fffffffffffff686;
  undefined2 in_stack_fffffffffffff688;
  undefined2 in_stack_fffffffffffff68a;
  undefined2 in_stack_fffffffffffff68c;
  undefined2 in_stack_fffffffffffff68e;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  byte local_718;
  undefined1 uStack_717;
  byte bStack_716;
  undefined1 uStack_715;
  byte bStack_714;
  undefined1 uStack_713;
  byte bStack_712;
  undefined1 uStack_711;
  byte bStack_710;
  undefined1 uStack_70f;
  byte bStack_70e;
  undefined1 uStack_70d;
  byte bStack_70c;
  undefined1 uStack_70b;
  byte bStack_70a;
  undefined1 uStack_709;
  byte local_708;
  undefined1 uStack_707;
  byte bStack_706;
  undefined1 uStack_705;
  byte bStack_704;
  undefined1 uStack_703;
  byte bStack_702;
  undefined1 uStack_701;
  byte bStack_700;
  undefined1 uStack_6ff;
  byte bStack_6fe;
  undefined1 uStack_6fd;
  byte bStack_6fc;
  undefined1 uStack_6fb;
  byte bStack_6fa;
  undefined1 uStack_6f9;
  byte local_6f8;
  undefined1 uStack_6f7;
  byte bStack_6f6;
  undefined1 uStack_6f5;
  byte bStack_6f4;
  undefined1 uStack_6f3;
  byte bStack_6f2;
  undefined1 uStack_6f1;
  byte bStack_6f0;
  undefined1 uStack_6ef;
  byte bStack_6ee;
  undefined1 uStack_6ed;
  byte bStack_6ec;
  undefined1 uStack_6eb;
  byte bStack_6ea;
  undefined1 uStack_6e9;
  byte local_6e8;
  undefined1 uStack_6e7;
  byte bStack_6e6;
  undefined1 uStack_6e5;
  byte bStack_6e4;
  undefined1 uStack_6e3;
  byte bStack_6e2;
  undefined1 uStack_6e1;
  byte bStack_6e0;
  undefined1 uStack_6df;
  byte bStack_6de;
  undefined1 uStack_6dd;
  byte bStack_6dc;
  undefined1 uStack_6db;
  byte bStack_6da;
  undefined1 uStack_6d9;
  undefined1 (*local_6c0) [16];
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  short local_688;
  short sStack_686;
  short sStack_684;
  short sStack_682;
  short sStack_680;
  short sStack_67e;
  short local_668;
  short sStack_666;
  short sStack_660;
  short sStack_65e;
  short local_648;
  short sStack_646;
  short sStack_5c6;
  short sStack_5c4;
  short sStack_5c2;
  short sStack_5ba;
  short sStack_5b6;
  short sStack_5b4;
  short sStack_5b2;
  short sStack_5aa;
  short sStack_5a6;
  short sStack_5a4;
  short sStack_5a2;
  short sStack_59a;
  short sStack_596;
  short sStack_594;
  short sStack_592;
  short sStack_58a;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  int local_468;
  int iStack_464;
  int iStack_460;
  int iStack_45c;
  int local_458;
  int iStack_454;
  int iStack_450;
  int iStack_44c;
  int local_448;
  int iStack_444;
  int iStack_440;
  int iStack_43c;
  int local_438;
  int iStack_434;
  int iStack_430;
  int iStack_42c;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 *local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 *local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 *local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  short sStack_266;
  short sStack_264;
  short sStack_262;
  short sStack_25a;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_24a;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_23a;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_22a;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined4 uStack_160;
  undefined4 uStack_150;
  undefined4 uStack_140;
  undefined4 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  
  local_6a8 = 0;
  uStack_6a0 = 0;
  local_348 = *in_RDI;
  uStack_340 = 0;
  local_350 = in_RDI + 4;
  local_368 = *local_350;
  uStack_360 = 0;
  local_370 = in_RDI + 8;
  local_388 = *local_370;
  uStack_380 = 0;
  local_390 = in_RDI + 0xc;
  local_3a8 = *local_390;
  uStack_3a0 = 0;
  local_3c8 = *in_RSI;
  uStack_3c0 = 0;
  local_3d0 = in_RSI + 4;
  local_3e8 = *local_3d0;
  uStack_3e0 = 0;
  local_3f0 = in_RSI + 8;
  local_408 = *local_3f0;
  uStack_400 = 0;
  local_410 = in_RSI + 0xc;
  local_428 = *local_410;
  uStack_420 = 0;
  uStack_b0 = 0;
  uStack_c0 = 0;
  local_b8._0_4_ = (undefined4)local_348;
  local_b8._4_4_ = (undefined4)((ulong)local_348 >> 0x20);
  local_c8._0_4_ = (undefined4)local_3c8;
  local_c8._4_4_ = (undefined4)((ulong)local_3c8 >> 0x20);
  uStack_d0 = 0;
  uStack_e0 = 0;
  local_d8._0_4_ = (undefined4)local_368;
  local_d8._4_4_ = (undefined4)((ulong)local_368 >> 0x20);
  local_e8._0_4_ = (undefined4)local_3e8;
  local_e8._4_4_ = (undefined4)((ulong)local_3e8 >> 0x20);
  uStack_f0 = 0;
  uStack_100 = 0;
  local_f8._0_4_ = (undefined4)local_388;
  local_f8._4_4_ = (undefined4)((ulong)local_388 >> 0x20);
  local_108._0_4_ = (undefined4)local_408;
  local_108._4_4_ = (undefined4)((ulong)local_408 >> 0x20);
  uStack_110 = 0;
  uStack_120 = 0;
  local_118._0_4_ = (undefined4)local_3a8;
  local_118._4_4_ = (undefined4)((ulong)local_3a8 >> 0x20);
  local_128._0_4_ = (undefined4)local_428;
  local_128._4_4_ = (undefined4)((ulong)local_428 >> 0x20);
  uStack_2b0 = CONCAT44(local_c8._4_4_,local_b8._4_4_);
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2b8._0_1_ = (byte)local_348;
  local_2b8._1_1_ = (byte)((ulong)local_348 >> 8);
  local_2b8._2_1_ = (byte)((ulong)local_348 >> 0x10);
  local_2b8._3_1_ = (byte)((ulong)local_348 >> 0x18);
  local_2b8._4_1_ = (byte)local_3c8;
  local_2b8._5_1_ = (byte)((ulong)local_3c8 >> 8);
  local_2b8._6_1_ = (byte)((ulong)local_3c8 >> 0x10);
  local_2b8._7_1_ = (byte)((ulong)local_3c8 >> 0x18);
  local_6e8 = (byte)local_2b8;
  uStack_6e7 = 0;
  bStack_6e6 = local_2b8._1_1_;
  uStack_6e5 = 0;
  bStack_6e4 = local_2b8._2_1_;
  uStack_6e3 = 0;
  bStack_6e2 = local_2b8._3_1_;
  uStack_6e1 = 0;
  bStack_6e0 = local_2b8._4_1_;
  uStack_6df = 0;
  bStack_6de = local_2b8._5_1_;
  uStack_6dd = 0;
  bStack_6dc = local_2b8._6_1_;
  uStack_6db = 0;
  bStack_6da = local_2b8._7_1_;
  uStack_6d9 = 0;
  uStack_2d0 = CONCAT44(local_e8._4_4_,local_d8._4_4_);
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2d8._0_1_ = (byte)local_368;
  local_2d8._1_1_ = (byte)((ulong)local_368 >> 8);
  local_2d8._2_1_ = (byte)((ulong)local_368 >> 0x10);
  local_2d8._3_1_ = (byte)((ulong)local_368 >> 0x18);
  local_2d8._4_1_ = (byte)local_3e8;
  local_2d8._5_1_ = (byte)((ulong)local_3e8 >> 8);
  local_2d8._6_1_ = (byte)((ulong)local_3e8 >> 0x10);
  local_2d8._7_1_ = (byte)((ulong)local_3e8 >> 0x18);
  local_6f8 = (byte)local_2d8;
  uStack_6f7 = 0;
  bStack_6f6 = local_2d8._1_1_;
  uStack_6f5 = 0;
  bStack_6f4 = local_2d8._2_1_;
  uStack_6f3 = 0;
  bStack_6f2 = local_2d8._3_1_;
  uStack_6f1 = 0;
  bStack_6f0 = local_2d8._4_1_;
  uStack_6ef = 0;
  bStack_6ee = local_2d8._5_1_;
  uStack_6ed = 0;
  bStack_6ec = local_2d8._6_1_;
  uStack_6eb = 0;
  bStack_6ea = local_2d8._7_1_;
  uStack_6e9 = 0;
  uStack_2f0 = CONCAT44(local_108._4_4_,local_f8._4_4_);
  local_308 = 0;
  uStack_300 = 0;
  local_2f8._0_1_ = (byte)local_388;
  local_2f8._1_1_ = (byte)((ulong)local_388 >> 8);
  local_2f8._2_1_ = (byte)((ulong)local_388 >> 0x10);
  local_2f8._3_1_ = (byte)((ulong)local_388 >> 0x18);
  local_2f8._4_1_ = (byte)local_408;
  local_2f8._5_1_ = (byte)((ulong)local_408 >> 8);
  local_2f8._6_1_ = (byte)((ulong)local_408 >> 0x10);
  local_2f8._7_1_ = (byte)((ulong)local_408 >> 0x18);
  local_708 = (byte)local_2f8;
  uStack_707 = 0;
  bStack_706 = local_2f8._1_1_;
  uStack_705 = 0;
  bStack_704 = local_2f8._2_1_;
  uStack_703 = 0;
  bStack_702 = local_2f8._3_1_;
  uStack_701 = 0;
  bStack_700 = local_2f8._4_1_;
  uStack_6ff = 0;
  bStack_6fe = local_2f8._5_1_;
  uStack_6fd = 0;
  bStack_6fc = local_2f8._6_1_;
  uStack_6fb = 0;
  bStack_6fa = local_2f8._7_1_;
  uStack_6f9 = 0;
  uStack_310 = CONCAT44(local_128._4_4_,local_118._4_4_);
  local_328 = 0;
  uStack_320 = 0;
  local_318._0_1_ = (byte)local_3a8;
  local_318._1_1_ = (byte)((ulong)local_3a8 >> 8);
  local_318._2_1_ = (byte)((ulong)local_3a8 >> 0x10);
  local_318._3_1_ = (byte)((ulong)local_3a8 >> 0x18);
  local_318._4_1_ = (byte)local_428;
  local_318._5_1_ = (byte)((ulong)local_428 >> 8);
  local_318._6_1_ = (byte)((ulong)local_428 >> 0x10);
  local_318._7_1_ = (byte)((ulong)local_428 >> 0x18);
  local_718 = (byte)local_318;
  uStack_717 = 0;
  bStack_716 = local_318._1_1_;
  uStack_715 = 0;
  bStack_714 = local_318._2_1_;
  uStack_713 = 0;
  bStack_712 = local_318._3_1_;
  uStack_711 = 0;
  bStack_710 = local_318._4_1_;
  uStack_70f = 0;
  bStack_70e = local_318._5_1_;
  uStack_70d = 0;
  bStack_70c = local_318._6_1_;
  uStack_70b = 0;
  bStack_70a = local_318._7_1_;
  uStack_709 = 0;
  uVar35 = CONCAT16(local_2b8._3_1_,
                    (uint6)CONCAT14(local_2b8._2_1_,
                                    (uint)CONCAT12(local_2b8._1_1_,(ushort)(byte)local_2b8)));
  uVar36 = CONCAT16(local_2b8._7_1_,
                    (uint6)CONCAT14(local_2b8._6_1_,
                                    (uint)CONCAT12(local_2b8._5_1_,(ushort)local_2b8._4_1_)));
  uVar29 = CONCAT16(local_2f8._3_1_,
                    (uint6)CONCAT14(local_2f8._2_1_,
                                    (uint)CONCAT12(local_2f8._1_1_,(ushort)(byte)local_2f8)));
  uVar30 = CONCAT16(local_2f8._7_1_,
                    (uint6)CONCAT14(local_2f8._6_1_,
                                    (uint)CONCAT12(local_2f8._5_1_,(ushort)local_2f8._4_1_)));
  local_1b8._2_2_ = (ushort)local_2b8._1_1_;
  local_1b8._4_2_ = (ushort)local_2b8._2_1_;
  local_1b8._6_2_ = (ushort)local_2b8._3_1_;
  uStack_1b0._2_2_ = (ushort)local_2b8._5_1_;
  uStack_1b0._4_2_ = (ushort)local_2b8._6_1_;
  uStack_1b0._6_2_ = (ushort)local_2b8._7_1_;
  local_1c8._2_2_ = (ushort)local_2f8._1_1_;
  local_1c8._4_2_ = (ushort)local_2f8._2_1_;
  local_1c8._6_2_ = (ushort)local_2f8._3_1_;
  uStack_1c0._2_2_ = (ushort)local_2f8._5_1_;
  uStack_1c0._4_2_ = (ushort)local_2f8._6_1_;
  uStack_1c0._6_2_ = (ushort)local_2f8._7_1_;
  sVar37 = (ushort)(byte)local_2b8 + (ushort)(byte)local_2f8;
  sVar57 = (ushort)local_2b8._4_1_ + (ushort)local_2f8._4_1_;
  uVar31 = CONCAT16(local_2d8._3_1_,
                    (uint6)CONCAT14(local_2d8._2_1_,
                                    (uint)CONCAT12(local_2d8._1_1_,(ushort)(byte)local_2d8)));
  uVar34 = CONCAT16(local_2d8._7_1_,
                    (uint6)CONCAT14(local_2d8._6_1_,
                                    (uint)CONCAT12(local_2d8._5_1_,(ushort)local_2d8._4_1_)));
  uVar25 = CONCAT16(local_318._3_1_,
                    (uint6)CONCAT14(local_318._2_1_,
                                    (uint)CONCAT12(local_318._1_1_,(ushort)(byte)local_318)));
  uVar28 = CONCAT16(local_318._7_1_,
                    (uint6)CONCAT14(local_318._6_1_,
                                    (uint)CONCAT12(local_318._5_1_,(ushort)local_318._4_1_)));
  local_1d8._2_2_ = (ushort)local_2d8._1_1_;
  local_1d8._4_2_ = (ushort)local_2d8._2_1_;
  local_1d8._6_2_ = (ushort)local_2d8._3_1_;
  uStack_1d0._2_2_ = (ushort)local_2d8._5_1_;
  uStack_1d0._4_2_ = (ushort)local_2d8._6_1_;
  uStack_1d0._6_2_ = (ushort)local_2d8._7_1_;
  local_1e8._2_2_ = (ushort)local_318._1_1_;
  local_1e8._4_2_ = (ushort)local_318._2_1_;
  local_1e8._6_2_ = (ushort)local_318._3_1_;
  uStack_1e0._2_2_ = (ushort)local_318._5_1_;
  uStack_1e0._4_2_ = (ushort)local_318._6_1_;
  uStack_1e0._6_2_ = (ushort)local_318._7_1_;
  sVar38 = (ushort)(byte)local_2d8 + (ushort)(byte)local_318;
  sVar58 = (ushort)local_2d8._4_1_ + (ushort)local_318._4_1_;
  local_518._2_2_ = (ushort)local_2d8._1_1_;
  local_518._4_2_ = (ushort)local_2d8._2_1_;
  local_518._6_2_ = (ushort)local_2d8._3_1_;
  uStack_510._2_2_ = (ushort)local_2d8._5_1_;
  uStack_510._4_2_ = (ushort)local_2d8._6_1_;
  uStack_510._6_2_ = (ushort)local_2d8._7_1_;
  local_528._2_2_ = (ushort)local_318._1_1_;
  local_528._4_2_ = (ushort)local_318._2_1_;
  local_528._6_2_ = (ushort)local_318._3_1_;
  uStack_520._2_2_ = (ushort)local_318._5_1_;
  uStack_520._4_2_ = (ushort)local_318._6_1_;
  uStack_520._6_2_ = (ushort)local_318._7_1_;
  sVar39 = (ushort)(byte)local_2d8 - (ushort)(byte)local_318;
  sVar59 = (ushort)local_2d8._4_1_ - (ushort)local_318._4_1_;
  local_538._2_2_ = (ushort)local_2b8._1_1_;
  local_538._4_2_ = (ushort)local_2b8._2_1_;
  local_538._6_2_ = (ushort)local_2b8._3_1_;
  uStack_530._2_2_ = (ushort)local_2b8._5_1_;
  uStack_530._4_2_ = (ushort)local_2b8._6_1_;
  uStack_530._6_2_ = (ushort)local_2b8._7_1_;
  local_548._2_2_ = (ushort)local_2f8._1_1_;
  local_548._4_2_ = (ushort)local_2f8._2_1_;
  local_548._6_2_ = (ushort)local_2f8._3_1_;
  uStack_540._2_2_ = (ushort)local_2f8._5_1_;
  uStack_540._4_2_ = (ushort)local_2f8._6_1_;
  uStack_540._6_2_ = (ushort)local_2f8._7_1_;
  sVar40 = (ushort)(byte)local_2b8 - (ushort)(byte)local_2f8;
  sVar60 = (ushort)local_2b8._4_1_ - (ushort)local_2f8._4_1_;
  local_1f8 = CONCAT26(local_1b8._6_2_ + local_1c8._6_2_,
                       CONCAT24(local_1b8._4_2_ + local_1c8._4_2_,
                                CONCAT22(local_1b8._2_2_ + local_1c8._2_2_,sVar37)));
  uStack_1f0 = CONCAT26(uStack_1b0._6_2_ + uStack_1c0._6_2_,
                        CONCAT24(uStack_1b0._4_2_ + uStack_1c0._4_2_,
                                 CONCAT22(uStack_1b0._2_2_ + uStack_1c0._2_2_,sVar57)));
  local_208 = CONCAT26(local_1d8._6_2_ + local_1e8._6_2_,
                       CONCAT24(local_1d8._4_2_ + local_1e8._4_2_,
                                CONCAT22(local_1d8._2_2_ + local_1e8._2_2_,sVar38)));
  uStack_200 = CONCAT26(uStack_1d0._6_2_ + uStack_1e0._6_2_,
                        CONCAT24(uStack_1d0._4_2_ + uStack_1e0._4_2_,
                                 CONCAT22(uStack_1d0._2_2_ + uStack_1e0._2_2_,sVar58)));
  local_218 = CONCAT26(local_538._6_2_ - local_548._6_2_,
                       CONCAT24(local_538._4_2_ - local_548._4_2_,
                                CONCAT22(local_538._2_2_ - local_548._2_2_,sVar40)));
  uStack_210 = CONCAT26(uStack_530._6_2_ - uStack_540._6_2_,
                        CONCAT24(uStack_530._4_2_ - uStack_540._4_2_,
                                 CONCAT22(uStack_530._2_2_ - uStack_540._2_2_,sVar60)));
  local_228 = CONCAT26(local_518._6_2_ - local_528._6_2_,
                       CONCAT24(local_518._4_2_ - local_528._4_2_,
                                CONCAT22(local_518._2_2_ - local_528._2_2_,sVar39)));
  uStack_220 = CONCAT26(uStack_510._6_2_ - uStack_520._6_2_,
                        CONCAT24(uStack_510._4_2_ - uStack_520._4_2_,
                                 CONCAT22(uStack_510._2_2_ - uStack_520._2_2_,sVar59)));
  local_558 = CONCAT26(local_538._6_2_ - local_548._6_2_,
                       CONCAT24(local_538._4_2_ - local_548._4_2_,
                                CONCAT22(local_538._2_2_ - local_548._2_2_,sVar40)));
  uStack_550 = CONCAT26(uStack_530._6_2_ - uStack_540._6_2_,
                        CONCAT24(uStack_530._4_2_ - uStack_540._4_2_,
                                 CONCAT22(uStack_530._2_2_ - uStack_540._2_2_,sVar60)));
  local_568 = CONCAT26(local_518._6_2_ - local_528._6_2_,
                       CONCAT24(local_518._4_2_ - local_528._4_2_,
                                CONCAT22(local_518._2_2_ - local_528._2_2_,sVar39)));
  uStack_560 = CONCAT26(uStack_510._6_2_ - uStack_520._6_2_,
                        CONCAT24(uStack_510._4_2_ - uStack_520._4_2_,
                                 CONCAT22(uStack_510._2_2_ - uStack_520._2_2_,sVar59)));
  local_578 = CONCAT26(local_1b8._6_2_ + local_1c8._6_2_,
                       CONCAT24(local_1b8._4_2_ + local_1c8._4_2_,
                                CONCAT22(local_1b8._2_2_ + local_1c8._2_2_,sVar37)));
  uStack_570 = CONCAT26(uStack_1b0._6_2_ + uStack_1c0._6_2_,
                        CONCAT24(uStack_1b0._4_2_ + uStack_1c0._4_2_,
                                 CONCAT22(uStack_1b0._2_2_ + uStack_1c0._2_2_,sVar57)));
  local_588 = CONCAT26(local_1d8._6_2_ + local_1e8._6_2_,
                       CONCAT24(local_1d8._4_2_ + local_1e8._4_2_,
                                CONCAT22(local_1d8._2_2_ + local_1e8._2_2_,sVar38)));
  uStack_580 = CONCAT26(uStack_1d0._6_2_ + uStack_1e0._6_2_,
                        CONCAT24(uStack_1d0._4_2_ + uStack_1e0._4_2_,
                                 CONCAT22(uStack_1d0._2_2_ + uStack_1e0._2_2_,sVar58)));
  out2 = (__m128i *)CONCAT44(local_128._4_4_,local_118._4_4_);
  out3 = (__m128i *)CONCAT44((undefined4)local_108,(undefined4)local_f8);
  local_6c0 = in_RDX;
  local_548 = (ulong)CONCAT16(local_2f8._3_1_,
                              (uint6)CONCAT14(local_2f8._2_1_,
                                              (uint)CONCAT12(local_2f8._1_1_,(ushort)(byte)local_2f8
                                                            )));
  uStack_540 = (ulong)CONCAT16(local_2f8._7_1_,
                               (uint6)CONCAT14(local_2f8._6_1_,
                                               (uint)CONCAT12(local_2f8._5_1_,
                                                              (ushort)local_2f8._4_1_)));
  local_538 = (ulong)CONCAT16(local_2b8._3_1_,
                              (uint6)CONCAT14(local_2b8._2_1_,
                                              (uint)CONCAT12(local_2b8._1_1_,(ushort)(byte)local_2b8
                                                            )));
  uStack_530 = (ulong)CONCAT16(local_2b8._7_1_,
                               (uint6)CONCAT14(local_2b8._6_1_,
                                               (uint)CONCAT12(local_2b8._5_1_,
                                                              (ushort)local_2b8._4_1_)));
  local_528 = (ulong)CONCAT16(local_318._3_1_,
                              (uint6)CONCAT14(local_318._2_1_,
                                              (uint)CONCAT12(local_318._1_1_,(ushort)(byte)local_318
                                                            )));
  uStack_520 = (ulong)CONCAT16(local_318._7_1_,
                               (uint6)CONCAT14(local_318._6_1_,
                                               (uint)CONCAT12(local_318._5_1_,
                                                              (ushort)local_318._4_1_)));
  local_518 = (ulong)CONCAT16(local_2d8._3_1_,
                              (uint6)CONCAT14(local_2d8._2_1_,
                                              (uint)CONCAT12(local_2d8._1_1_,(ushort)(byte)local_2d8
                                                            )));
  uStack_510 = (ulong)CONCAT16(local_2d8._7_1_,
                               (uint6)CONCAT14(local_2d8._6_1_,
                                               (uint)CONCAT12(local_2d8._5_1_,
                                                              (ushort)local_2d8._4_1_)));
  local_318 = CONCAT44((undefined4)local_128,(undefined4)local_118);
  local_2f8 = CONCAT44((undefined4)local_108,(undefined4)local_f8);
  local_2d8 = CONCAT44((undefined4)local_e8,(undefined4)local_d8);
  local_2b8 = CONCAT44((undefined4)local_c8,(undefined4)local_b8);
  local_1e8 = (ulong)uVar25;
  uStack_1e0 = (ulong)uVar28;
  local_1d8 = (ulong)uVar31;
  uStack_1d0 = (ulong)uVar34;
  local_1c8 = (ulong)uVar29;
  uStack_1c0 = (ulong)uVar30;
  local_1b8 = (ulong)uVar35;
  uStack_1b0 = (ulong)uVar36;
  local_128 = local_428;
  local_118 = local_3a8;
  local_108 = local_408;
  local_f8 = local_388;
  local_e8 = local_3e8;
  local_d8 = local_368;
  local_c8 = local_3c8;
  local_b8 = local_348;
  VP8Transpose_2_4x4_16b
            ((__m128i *)
             CONCAT26(in_stack_fffffffffffff68e,
                      CONCAT24(in_stack_fffffffffffff68c,
                               CONCAT22(in_stack_fffffffffffff68a,in_stack_fffffffffffff688))),
             (__m128i *)
             CONCAT26(in_stack_fffffffffffff686,
                      CONCAT24(in_stack_fffffffffffff684,
                               CONCAT22(in_stack_fffffffffffff682,in_stack_fffffffffffff680))),
             (__m128i *)
             CONCAT26(in_stack_fffffffffffff67e,
                      CONCAT24(in_stack_fffffffffffff67c,
                               CONCAT22(in_stack_fffffffffffff67a,in_stack_fffffffffffff678))),
             (__m128i *)&local_718,(__m128i *)&local_708,(__m128i *)0x16ba81,out2,out3);
  uVar32 = CONCAT13(uStack_6e5,CONCAT12(bStack_6e6,CONCAT11(uStack_6e7,local_6e8)));
  uVar33 = CONCAT15(uStack_6e3,CONCAT14(bStack_6e4,uVar32));
  uVar26 = CONCAT13(uStack_705,CONCAT12(bStack_706,CONCAT11(uStack_707,local_708)));
  uVar27 = CONCAT15(uStack_703,CONCAT14(bStack_704,uVar26));
  sStack_236 = (short)((uint)uVar32 >> 0x10);
  sStack_234 = (short)((uint6)uVar33 >> 0x20);
  sStack_232 = (short)(CONCAT17(uStack_6e1,CONCAT16(bStack_6e2,uVar33)) >> 0x30);
  sStack_22a = (short)(CONCAT13(uStack_6d9,CONCAT12(bStack_6da,CONCAT11(uStack_6db,bStack_6dc))) >>
                      0x10);
  sStack_246 = (short)((uint)uVar26 >> 0x10);
  sStack_244 = (short)((uint6)uVar27 >> 0x20);
  sStack_242 = (short)(CONCAT17(uStack_701,CONCAT16(bStack_702,uVar27)) >> 0x30);
  sStack_23a = (short)(CONCAT13(uStack_6f9,CONCAT12(bStack_6fa,CONCAT11(uStack_6fb,bStack_6fc))) >>
                      0x10);
  sVar41 = CONCAT11(uStack_6e7,local_6e8) + CONCAT11(uStack_707,local_708);
  sVar61 = CONCAT11(uStack_6db,bStack_6dc) + CONCAT11(uStack_6fb,bStack_6fc);
  uVar32 = CONCAT13(uStack_6f5,CONCAT12(bStack_6f6,CONCAT11(uStack_6f7,local_6f8)));
  uVar33 = CONCAT15(uStack_6f3,CONCAT14(bStack_6f4,uVar32));
  uVar26 = CONCAT13(uStack_715,CONCAT12(bStack_716,CONCAT11(uStack_717,local_718)));
  uVar27 = CONCAT15(uStack_713,CONCAT14(bStack_714,uVar26));
  sStack_256 = (short)((uint)uVar32 >> 0x10);
  sStack_254 = (short)((uint6)uVar33 >> 0x20);
  sStack_252 = (short)(CONCAT17(uStack_6f1,CONCAT16(bStack_6f2,uVar33)) >> 0x30);
  sStack_24a = (short)(CONCAT13(uStack_6e9,CONCAT12(bStack_6ea,CONCAT11(uStack_6eb,bStack_6ec))) >>
                      0x10);
  sStack_266 = (short)((uint)uVar26 >> 0x10);
  sStack_264 = (short)((uint6)uVar27 >> 0x20);
  sStack_262 = (short)(CONCAT17(uStack_711,CONCAT16(bStack_712,uVar27)) >> 0x30);
  sStack_25a = (short)(CONCAT13(uStack_709,CONCAT12(bStack_70a,CONCAT11(uStack_70b,bStack_70c))) >>
                      0x10);
  sVar37 = CONCAT11(uStack_6f7,local_6f8) + CONCAT11(uStack_717,local_718);
  sVar38 = CONCAT11(uStack_6eb,bStack_6ec) + CONCAT11(uStack_70b,bStack_70c);
  uVar32 = CONCAT13(uStack_6f5,CONCAT12(bStack_6f6,CONCAT11(uStack_6f7,local_6f8)));
  uVar33 = CONCAT15(uStack_6f3,CONCAT14(bStack_6f4,uVar32));
  uVar26 = CONCAT13(uStack_715,CONCAT12(bStack_716,CONCAT11(uStack_717,local_718)));
  uVar27 = CONCAT15(uStack_713,CONCAT14(bStack_714,uVar26));
  sStack_596 = (short)((uint)uVar32 >> 0x10);
  sStack_594 = (short)((uint6)uVar33 >> 0x20);
  sStack_592 = (short)(CONCAT17(uStack_6f1,CONCAT16(bStack_6f2,uVar33)) >> 0x30);
  sStack_58a = (short)(CONCAT13(uStack_6e9,CONCAT12(bStack_6ea,CONCAT11(uStack_6eb,bStack_6ec))) >>
                      0x10);
  sStack_5a6 = (short)((uint)uVar26 >> 0x10);
  sStack_5a4 = (short)((uint6)uVar27 >> 0x20);
  sStack_5a2 = (short)(CONCAT17(uStack_711,CONCAT16(bStack_712,uVar27)) >> 0x30);
  sStack_59a = (short)(CONCAT13(uStack_709,CONCAT12(bStack_70a,CONCAT11(uStack_70b,bStack_70c))) >>
                      0x10);
  sVar39 = CONCAT11(uStack_6eb,bStack_6ec) - CONCAT11(uStack_70b,bStack_70c);
  uVar32 = CONCAT13(uStack_6e5,CONCAT12(bStack_6e6,CONCAT11(uStack_6e7,local_6e8)));
  uVar33 = CONCAT15(uStack_6e3,CONCAT14(bStack_6e4,uVar32));
  uVar26 = CONCAT13(uStack_705,CONCAT12(bStack_706,CONCAT11(uStack_707,local_708)));
  uVar27 = CONCAT15(uStack_703,CONCAT14(bStack_704,uVar26));
  sStack_5b6 = (short)((uint)uVar32 >> 0x10);
  sStack_5b4 = (short)((uint6)uVar33 >> 0x20);
  sStack_5b2 = (short)(CONCAT17(uStack_6e1,CONCAT16(bStack_6e2,uVar33)) >> 0x30);
  sStack_5aa = (short)(CONCAT13(uStack_6d9,CONCAT12(bStack_6da,CONCAT11(uStack_6db,bStack_6dc))) >>
                      0x10);
  sStack_5c6 = (short)((uint)uVar26 >> 0x10);
  sStack_5c4 = (short)((uint6)uVar27 >> 0x20);
  sStack_5c2 = (short)(CONCAT17(uStack_701,CONCAT16(bStack_702,uVar27)) >> 0x30);
  sStack_5ba = (short)(CONCAT13(uStack_6f9,CONCAT12(bStack_6fa,CONCAT11(uStack_6fb,bStack_6fc))) >>
                      0x10);
  sVar62 = CONCAT11(uStack_6db,bStack_6dc) - CONCAT11(uStack_6fb,bStack_6fc);
  sVar42 = sVar41 + sVar37;
  sVar48 = sStack_236 + sStack_246 + sStack_256 + sStack_266;
  sVar51 = sStack_234 + sStack_244 + sStack_254 + sStack_264;
  sVar54 = sStack_232 + sStack_242 + sStack_252 + sStack_262;
  sVar63 = sVar61 + sVar38;
  sVar65 = sStack_22a + sStack_23a + sStack_24a + sStack_25a;
  sVar43 = (CONCAT11(uStack_6e7,local_6e8) - CONCAT11(uStack_707,local_708)) +
           (CONCAT11(uStack_6f7,local_6f8) - CONCAT11(uStack_717,local_718));
  sVar49 = (sStack_5b6 - sStack_5c6) + (sStack_596 - sStack_5a6);
  sVar52 = (sStack_5b4 - sStack_5c4) + (sStack_594 - sStack_5a4);
  sVar55 = (sStack_5b2 - sStack_5c2) + (sStack_592 - sStack_5a2);
  sVar64 = sVar62 + sVar39;
  sVar66 = (sStack_5aa - sStack_5ba) + (sStack_58a - sStack_59a);
  sVar62 = sVar62 - sVar39;
  sVar67 = (sStack_5aa - sStack_5ba) - (sStack_58a - sStack_59a);
  sVar41 = sVar41 - sVar37;
  sVar50 = (sStack_236 + sStack_246) - (sStack_256 + sStack_266);
  sVar53 = (sStack_234 + sStack_244) - (sStack_254 + sStack_264);
  sVar56 = (sStack_232 + sStack_242) - (sStack_252 + sStack_262);
  sVar61 = sVar61 - sVar38;
  sVar68 = (sStack_22a + sStack_23a) - (sStack_24a + sStack_25a);
  sVar37 = -sVar42;
  sVar38 = -sVar48;
  sVar39 = -sVar51;
  sVar40 = -sVar54;
  sVar57 = -sVar43;
  sVar58 = -sVar49;
  sVar59 = -sVar52;
  sVar60 = -sVar55;
  local_648 = (short)uStack_140;
  sStack_646 = (short)((uint)uStack_140 >> 0x10);
  sVar1 = -local_648;
  sVar2 = -sStack_646;
  sVar3 = -sVar64;
  sVar4 = -sVar66;
  sVar5 = -sVar41;
  sVar6 = -sVar50;
  sVar7 = -sVar53;
  sVar8 = -sVar56;
  local_668 = (short)uStack_160;
  sStack_666 = (short)((uint)uStack_160 >> 0x10);
  sStack_660 = (short)uStack_130;
  sStack_65e = (short)((uint)uStack_130 >> 0x10);
  sVar9 = -local_668;
  sVar10 = -sStack_666;
  sVar11 = -sVar61;
  sVar12 = -sVar68;
  sVar13 = -sStack_660;
  sVar14 = -sStack_65e;
  sVar15 = -sVar63;
  sVar16 = -sVar65;
  local_688 = (short)local_948;
  sStack_686 = (short)((ulong)local_948 >> 0x10);
  sStack_684 = (short)((ulong)local_948 >> 0x20);
  sStack_682 = (short)((ulong)local_948 >> 0x30);
  sStack_680 = (short)uStack_150;
  sStack_67e = (short)((uint)uStack_150 >> 0x10);
  sVar17 = -local_688;
  sVar18 = -sStack_686;
  sVar19 = -sStack_684;
  sVar20 = -sStack_682;
  sVar21 = -sStack_680;
  sVar22 = -sStack_67e;
  sVar23 = -sVar62;
  sVar24 = -sVar67;
  local_918._0_4_ =
       CONCAT22((ushort)(sVar48 < sVar38) * sVar38 | (ushort)(sVar48 >= sVar38) * sVar48,
                (ushort)(sVar42 < sVar37) * sVar37 | (ushort)(sVar42 >= sVar37) * sVar42);
  local_918._0_6_ =
       CONCAT24((ushort)(sVar51 < sVar39) * sVar39 | (ushort)(sVar51 >= sVar39) * sVar51,
                (undefined4)local_918);
  local_918 = CONCAT26((ushort)(sVar54 < sVar40) * sVar40 | (ushort)(sVar54 >= sVar40) * sVar54,
                       (undefined6)local_918);
  uStack_910._0_2_ = (ushort)(sVar43 < sVar57) * sVar57 | (ushort)(sVar43 >= sVar57) * sVar43;
  uStack_910._2_2_ = (ushort)(sVar49 < sVar58) * sVar58 | (ushort)(sVar49 >= sVar58) * sVar49;
  uStack_910._4_2_ = (ushort)(sVar52 < sVar59) * sVar59 | (ushort)(sVar52 >= sVar59) * sVar52;
  uStack_910._6_2_ = (ushort)(sVar55 < sVar60) * sVar60 | (ushort)(sVar55 >= sVar60) * sVar55;
  local_928._0_4_ =
       CONCAT22((ushort)(sStack_646 < sVar2) * sVar2 | (ushort)(sStack_646 >= sVar2) * sStack_646,
                (ushort)(local_648 < sVar1) * sVar1 | (ushort)(local_648 >= sVar1) * local_648);
  local_928._0_6_ =
       CONCAT24((ushort)(sVar64 < sVar3) * sVar3 | (ushort)(sVar64 >= sVar3) * sVar64,
                (undefined4)local_928);
  local_928 = CONCAT26((ushort)(sVar66 < sVar4) * sVar4 | (ushort)(sVar66 >= sVar4) * sVar66,
                       (undefined6)local_928);
  uStack_920._0_2_ = (ushort)(sVar41 < sVar5) * sVar5 | (ushort)(sVar41 >= sVar5) * sVar41;
  uStack_920._2_2_ = (ushort)(sVar50 < sVar6) * sVar6 | (ushort)(sVar50 >= sVar6) * sVar50;
  uStack_920._4_2_ = (ushort)(sVar53 < sVar7) * sVar7 | (ushort)(sVar53 >= sVar7) * sVar53;
  uStack_920._6_2_ = (ushort)(sVar56 < sVar8) * sVar8 | (ushort)(sVar56 >= sVar8) * sVar56;
  local_938._0_4_ =
       CONCAT22((ushort)(sStack_666 < sVar10) * sVar10 | (ushort)(sStack_666 >= sVar10) * sStack_666
                ,(ushort)(local_668 < sVar9) * sVar9 | (ushort)(local_668 >= sVar9) * local_668);
  local_938._0_6_ =
       CONCAT24((ushort)(sVar61 < sVar11) * sVar11 | (ushort)(sVar61 >= sVar11) * sVar61,
                (undefined4)local_938);
  local_938 = CONCAT26((ushort)(sVar68 < sVar12) * sVar12 | (ushort)(sVar68 >= sVar12) * sVar68,
                       (undefined6)local_938);
  uStack_930._0_2_ =
       (ushort)(sStack_660 < sVar13) * sVar13 | (ushort)(sStack_660 >= sVar13) * sStack_660;
  uStack_930._2_2_ =
       (ushort)(sStack_65e < sVar14) * sVar14 | (ushort)(sStack_65e >= sVar14) * sStack_65e;
  uStack_930._4_2_ = (ushort)(sVar63 < sVar15) * sVar15 | (ushort)(sVar63 >= sVar15) * sVar63;
  uStack_930._6_2_ = (ushort)(sVar65 < sVar16) * sVar16 | (ushort)(sVar65 >= sVar16) * sVar65;
  local_948._0_4_ =
       CONCAT22((ushort)(sStack_686 < sVar18) * sVar18 | (ushort)(sStack_686 >= sVar18) * sStack_686
                ,(ushort)(local_688 < sVar17) * sVar17 | (ushort)(local_688 >= sVar17) * local_688);
  local_948._0_6_ =
       CONCAT24((ushort)(sStack_684 < sVar19) * sVar19 | (ushort)(sStack_684 >= sVar19) * sStack_684
                ,(undefined4)local_948);
  local_948 = CONCAT26((ushort)(sStack_682 < sVar20) * sVar20 |
                       (ushort)(sStack_682 >= sVar20) * sStack_682,(undefined6)local_948);
  uStack_940._0_2_ =
       (ushort)(sStack_680 < sVar21) * sVar21 | (ushort)(sStack_680 >= sVar21) * sStack_680;
  uStack_940._2_2_ =
       (ushort)(sStack_67e < sVar22) * sVar22 | (ushort)(sStack_67e >= sVar22) * sStack_67e;
  uStack_940._4_2_ = (ushort)(sVar62 < sVar23) * sVar23 | (ushort)(sVar62 >= sVar23) * sVar62;
  uStack_940._6_2_ = (ushort)(sVar67 < sVar24) * sVar24 | (ushort)(sVar67 >= sVar24) * sVar67;
  auVar44._8_8_ = uStack_910;
  auVar44._0_8_ = local_918;
  auVar44 = pmaddwd(auVar44,*local_6c0);
  auVar45._8_8_ = uStack_920;
  auVar45._0_8_ = local_928;
  auVar45 = pmaddwd(auVar45,local_6c0[1]);
  auVar46._8_8_ = uStack_930;
  auVar46._0_8_ = local_938;
  auVar46 = pmaddwd(auVar46,*local_6c0);
  auVar47._8_8_ = uStack_940;
  auVar47._0_8_ = local_948;
  auVar47 = pmaddwd(auVar47,local_6c0[1]);
  local_438 = auVar44._0_4_;
  iStack_434 = auVar44._4_4_;
  iStack_430 = auVar44._8_4_;
  iStack_42c = auVar44._12_4_;
  local_448 = auVar45._0_4_;
  iStack_444 = auVar45._4_4_;
  iStack_440 = auVar45._8_4_;
  iStack_43c = auVar45._12_4_;
  local_458 = auVar46._0_4_;
  iStack_454 = auVar46._4_4_;
  iStack_450 = auVar46._8_4_;
  iStack_44c = auVar46._12_4_;
  local_468 = auVar47._0_4_;
  iStack_464 = auVar47._4_4_;
  iStack_460 = auVar47._8_4_;
  iStack_45c = auVar47._12_4_;
  return ((local_438 + local_448) - (local_458 + local_468)) +
         ((iStack_434 + iStack_444) - (iStack_454 + iStack_464)) +
         ((iStack_430 + iStack_440) - (iStack_450 + iStack_460)) +
         ((iStack_42c + iStack_43c) - (iStack_44c + iStack_45c));
}

Assistant:

static int TTransform_SSE2(const uint8_t* WEBP_RESTRICT inA,
                           const uint8_t* WEBP_RESTRICT inB,
                           const uint16_t* WEBP_RESTRICT const w) {
  int32_t sum[4];
  __m128i tmp_0, tmp_1, tmp_2, tmp_3;
  const __m128i zero = _mm_setzero_si128();

  // Load and combine inputs.
  {
    const __m128i inA_0 = _mm_loadl_epi64((const __m128i*)&inA[BPS * 0]);
    const __m128i inA_1 = _mm_loadl_epi64((const __m128i*)&inA[BPS * 1]);
    const __m128i inA_2 = _mm_loadl_epi64((const __m128i*)&inA[BPS * 2]);
    const __m128i inA_3 = _mm_loadl_epi64((const __m128i*)&inA[BPS * 3]);
    const __m128i inB_0 = _mm_loadl_epi64((const __m128i*)&inB[BPS * 0]);
    const __m128i inB_1 = _mm_loadl_epi64((const __m128i*)&inB[BPS * 1]);
    const __m128i inB_2 = _mm_loadl_epi64((const __m128i*)&inB[BPS * 2]);
    const __m128i inB_3 = _mm_loadl_epi64((const __m128i*)&inB[BPS * 3]);

    // Combine inA and inB (we'll do two transforms in parallel).
    const __m128i inAB_0 = _mm_unpacklo_epi32(inA_0, inB_0);
    const __m128i inAB_1 = _mm_unpacklo_epi32(inA_1, inB_1);
    const __m128i inAB_2 = _mm_unpacklo_epi32(inA_2, inB_2);
    const __m128i inAB_3 = _mm_unpacklo_epi32(inA_3, inB_3);
    tmp_0 = _mm_unpacklo_epi8(inAB_0, zero);
    tmp_1 = _mm_unpacklo_epi8(inAB_1, zero);
    tmp_2 = _mm_unpacklo_epi8(inAB_2, zero);
    tmp_3 = _mm_unpacklo_epi8(inAB_3, zero);
    // a00 a01 a02 a03   b00 b01 b02 b03
    // a10 a11 a12 a13   b10 b11 b12 b13
    // a20 a21 a22 a23   b20 b21 b22 b23
    // a30 a31 a32 a33   b30 b31 b32 b33
  }

  // Vertical pass first to avoid a transpose (vertical and horizontal passes
  // are commutative because w/kWeightY is symmetric) and subsequent transpose.
  {
    // Calculate a and b (two 4x4 at once).
    const __m128i a0 = _mm_add_epi16(tmp_0, tmp_2);
    const __m128i a1 = _mm_add_epi16(tmp_1, tmp_3);
    const __m128i a2 = _mm_sub_epi16(tmp_1, tmp_3);
    const __m128i a3 = _mm_sub_epi16(tmp_0, tmp_2);
    const __m128i b0 = _mm_add_epi16(a0, a1);
    const __m128i b1 = _mm_add_epi16(a3, a2);
    const __m128i b2 = _mm_sub_epi16(a3, a2);
    const __m128i b3 = _mm_sub_epi16(a0, a1);
    // a00 a01 a02 a03   b00 b01 b02 b03
    // a10 a11 a12 a13   b10 b11 b12 b13
    // a20 a21 a22 a23   b20 b21 b22 b23
    // a30 a31 a32 a33   b30 b31 b32 b33

    // Transpose the two 4x4.
    VP8Transpose_2_4x4_16b(&b0, &b1, &b2, &b3, &tmp_0, &tmp_1, &tmp_2, &tmp_3);
  }

  // Horizontal pass and difference of weighted sums.
  {
    // Load all inputs.
    const __m128i w_0 = _mm_loadu_si128((const __m128i*)&w[0]);
    const __m128i w_8 = _mm_loadu_si128((const __m128i*)&w[8]);

    // Calculate a and b (two 4x4 at once).
    const __m128i a0 = _mm_add_epi16(tmp_0, tmp_2);
    const __m128i a1 = _mm_add_epi16(tmp_1, tmp_3);
    const __m128i a2 = _mm_sub_epi16(tmp_1, tmp_3);
    const __m128i a3 = _mm_sub_epi16(tmp_0, tmp_2);
    const __m128i b0 = _mm_add_epi16(a0, a1);
    const __m128i b1 = _mm_add_epi16(a3, a2);
    const __m128i b2 = _mm_sub_epi16(a3, a2);
    const __m128i b3 = _mm_sub_epi16(a0, a1);

    // Separate the transforms of inA and inB.
    __m128i A_b0 = _mm_unpacklo_epi64(b0, b1);
    __m128i A_b2 = _mm_unpacklo_epi64(b2, b3);
    __m128i B_b0 = _mm_unpackhi_epi64(b0, b1);
    __m128i B_b2 = _mm_unpackhi_epi64(b2, b3);

    {
      const __m128i d0 = _mm_sub_epi16(zero, A_b0);
      const __m128i d1 = _mm_sub_epi16(zero, A_b2);
      const __m128i d2 = _mm_sub_epi16(zero, B_b0);
      const __m128i d3 = _mm_sub_epi16(zero, B_b2);
      A_b0 = _mm_max_epi16(A_b0, d0);   // abs(v), 16b
      A_b2 = _mm_max_epi16(A_b2, d1);
      B_b0 = _mm_max_epi16(B_b0, d2);
      B_b2 = _mm_max_epi16(B_b2, d3);
    }

    // weighted sums
    A_b0 = _mm_madd_epi16(A_b0, w_0);
    A_b2 = _mm_madd_epi16(A_b2, w_8);
    B_b0 = _mm_madd_epi16(B_b0, w_0);
    B_b2 = _mm_madd_epi16(B_b2, w_8);
    A_b0 = _mm_add_epi32(A_b0, A_b2);
    B_b0 = _mm_add_epi32(B_b0, B_b2);

    // difference of weighted sums
    A_b0 = _mm_sub_epi32(A_b0, B_b0);
    _mm_storeu_si128((__m128i*)&sum[0], A_b0);
  }
  return sum[0] + sum[1] + sum[2] + sum[3];
}